

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O3

bool CheckSkipGameBlock(FScanner *sc)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  
  FScanner::MustGetStringName(sc,"(");
  bVar4 = 0;
  do {
    bVar1 = bVar4;
    FScanner::MustGetString(sc);
    iVar3 = strcasecmp(sc->String,GameNames[(int)gameinfo.gametype]);
    bVar4 = bVar1 | iVar3 == 0;
    bVar2 = FScanner::CheckString(sc,",");
  } while (bVar2);
  FScanner::MustGetStringName(sc,")");
  if (!(bool)(bVar1 | iVar3 == 0)) {
    SkipSubBlock(sc);
  }
  return (bool)~bVar4;
}

Assistant:

static bool CheckSkipGameBlock(FScanner &sc)
{
	bool filter = false;
	sc.MustGetStringName("(");
	do
	{
		sc.MustGetString();
		filter |= CheckGame(sc.String, false);
	}
	while (sc.CheckString(","));
	sc.MustGetStringName(")");
	if (!filter)
	{
		SkipSubBlock(sc);
		return true;
	}
	return false;
}